

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detokenize.c
# Opt level: O3

void av1_decode_palette_tokens(MACROBLOCKD *xd,int plane,aom_reader *r)

{
  uint16_t *icdf;
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  FRAME_CONTEXT *pFVar7;
  byte bVar8;
  byte bVar9;
  short sVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint stride;
  int iVar14;
  int iVar15;
  uint8_t *color_map;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  uint8_t *__s;
  ulong uVar22;
  uint uVar23;
  bool bVar24;
  ulong uVar25;
  int iVar26;
  uint palette_size;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  uint8_t *puVar33;
  MapCdf color_map_cdf;
  uint8_t local_38 [8];
  
  puVar33 = xd->plane[plane].color_index_map;
  lVar19 = 0x294e;
  if (plane == 0) {
    lVar19 = 0x26d8;
  }
  pFVar7 = xd->tile_ctx;
  BVar1 = (*xd->mi)->bsize;
  bVar17 = (byte)xd->plane[plane].subsampling_x;
  bVar2 = (byte)xd->plane[plane].subsampling_y;
  bVar8 = block_size_wide[BVar1] >> (bVar17 & 0x1f);
  bVar9 = block_size_high[BVar1] >> (bVar2 & 0x1f);
  uVar4 = xd->color_index_map_offset[plane];
  bVar3 = ((*xd->mi)->palette_mode_info).palette_size[plane];
  uVar22 = (ulong)bVar3;
  bVar24 = bVar8 < 4 && 0 < plane;
  iVar26 = (int)((xd->mb_to_bottom_edge >> 0x1f & xd->mb_to_bottom_edge >> 3) +
                (uint)block_size_high[BVar1]) >> (bVar2 & 0x1f);
  iVar30 = (int)((xd->mb_to_right_edge >> 0x1f & xd->mb_to_right_edge >> 3) +
                (uint)block_size_wide[BVar1]) >> (bVar17 & 0x1f);
  uVar21 = 0x1f;
  if (bVar3 != 0) {
    for (; bVar3 >> uVar21 == 0; uVar21 = uVar21 - 1) {
    }
  }
  uVar21 = (uVar21 ^ 0xffffffe0) + 0x21;
  if (bVar3 == 0) {
    uVar21 = 0;
  }
  iVar28 = (1 << ((byte)uVar21 & 0x1f)) - (uint)bVar3;
  uVar23 = 0;
  if (1 < uVar21) {
    uVar23 = 0;
    do {
      iVar11 = od_ec_decode_bool_q15(&r->ec,0x4000);
      uVar23 = uVar23 | iVar11 << ((char)uVar21 - 2U & 0x1f);
      uVar21 = uVar21 - 1;
    } while (1 < uVar21);
  }
  color_map = puVar33 + uVar4;
  uVar21 = (uint)(bVar9 < 4 && 0 < plane);
  uVar12 = iVar26 + uVar21 * 2;
  uVar27 = (ulong)uVar12;
  iVar11 = iVar30 + (uint)bVar24 * 2;
  if (iVar28 <= (int)uVar23) {
    iVar13 = od_ec_decode_bool_q15(&r->ec,0x4000);
    uVar23 = (uVar23 * 2 - iVar28) + iVar13;
  }
  stride = (uint)bVar8 + (uint)bVar24 * 2;
  *color_map = (uint8_t)uVar23;
  uVar23 = (uVar12 + iVar11) - 1;
  if (1 < (int)uVar23) {
    iVar28 = iVar11 + -1;
    palette_size = (uint)bVar3;
    uVar29 = 2;
    if (2 < palette_size) {
      uVar29 = palette_size;
    }
    uVar18 = (ulong)iVar28;
    uVar16 = 1;
    do {
      iVar14 = (int)uVar16;
      iVar13 = iVar28;
      if (iVar14 < iVar28) {
        iVar13 = iVar14;
      }
      iVar15 = iVar14 - uVar12;
      if (iVar15 < 0) {
        iVar15 = -1;
      }
      if (iVar15 < iVar13) {
        uVar20 = (ulong)iVar14;
        uVar32 = uVar18;
        if ((long)uVar20 < (long)uVar18) {
          uVar32 = uVar20;
        }
        uVar31 = uVar18;
        if ((long)uVar16 < (long)uVar18) {
          uVar31 = uVar16;
        }
        do {
          iVar13 = av1_get_palette_color_index_context
                             (color_map,stride,(int)(uVar20 - uVar32),(int)uVar31,palette_size,
                              local_38,(int *)0x0);
          icdf = (uint16_t *)((long)pFVar7 + (long)iVar13 * 0x12 + uVar22 * 0x5a + lVar19 + -0xb4);
          iVar13 = od_ec_decode_cdf_q15(&r->ec,icdf,palette_size);
          if (r->allow_update_cdf != '\0') {
            uVar5 = icdf[uVar22];
            bVar17 = (char)(uVar5 >> 4) + (3 < bVar3) + 4;
            uVar25 = 0;
            do {
              uVar6 = icdf[uVar25];
              if ((long)uVar25 < (long)(char)iVar13) {
                sVar10 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar17 & 0x1f));
              }
              else {
                sVar10 = -(uVar6 >> (bVar17 & 0x1f));
              }
              icdf[uVar25] = sVar10 + uVar6;
              uVar25 = uVar25 + 1;
            } while (uVar29 - 1 != uVar25);
            icdf[uVar22] = icdf[uVar22] + (ushort)(uVar5 < 0x20);
          }
          color_map[(uVar20 - uVar32) * (ulong)stride + uVar31] = local_38[iVar13];
          uVar31 = uVar31 - 1;
          uVar32 = uVar32 - 1;
        } while ((long)iVar15 < (long)uVar31);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar23);
  }
  if ((iVar30 < (int)(uint)bVar8) && (0 < (int)uVar12)) {
    __s = color_map + iVar11;
    do {
      memset(__s,(uint)__s[-1],(long)(int)(stride - iVar11));
      __s = __s + stride;
      uVar27 = uVar27 - 1;
    } while (uVar27 != 0);
  }
  if (iVar26 < (int)(uint)bVar9) {
    uVar22 = (ulong)stride;
    lVar19 = (ulong)((uint)bVar9 + uVar21 * 2) - (long)(int)uVar12;
    puVar33 = puVar33 + (long)(int)uVar12 * uVar22 + (ulong)uVar4;
    do {
      memcpy(puVar33,color_map + (int)((uVar12 - 1) * stride),uVar22);
      puVar33 = puVar33 + uVar22;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  return;
}

Assistant:

void av1_decode_palette_tokens(MACROBLOCKD *const xd, int plane,
                               aom_reader *r) {
  assert(plane == 0 || plane == 1);
  Av1ColorMapParam params;
  params.color_map =
      xd->plane[plane].color_index_map + xd->color_index_map_offset[plane];
  params.map_cdf = plane ? xd->tile_ctx->palette_uv_color_index_cdf
                         : xd->tile_ctx->palette_y_color_index_cdf;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  params.n_colors = mbmi->palette_mode_info.palette_size[plane];
  av1_get_block_dimensions(mbmi->bsize, plane, xd, &params.plane_width,
                           &params.plane_height, &params.rows, &params.cols);
  decode_color_map_tokens(&params, r);
}